

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGPtr xmlRelaxNGParseDocument(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  xmlChar *pxVar1;
  xmlRelaxNGGrammarPtr pxVar2;
  xmlRelaxNGGrammarPtr pxVar3;
  int iVar4;
  xmlRelaxNGPtr schema;
  xmlRelaxNGGrammarPtr_conflict pxVar5;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  xmlRelaxNGGrammarPtr pxVar7;
  xmlRelaxNGDefinePtr_conflict cur;
  
  schema = (xmlRelaxNGPtr)(*xmlMalloc)(0x50);
  if (schema == (xmlRelaxNGPtr)0x0) {
    xmlRngPErrMemory(ctxt,(char *)0x0);
    return (xmlRelaxNGPtr)0x0;
  }
  *(undefined8 *)&schema->defNr = 0;
  schema->defTab = (xmlRelaxNGDefinePtr_conflict *)0x0;
  schema->documents = (xmlRelaxNGDocumentPtr_conflict)0x0;
  schema->includes = (xmlRelaxNGIncludePtr_conflict)0x0;
  schema->defs = (xmlHashTablePtr)0x0;
  schema->refs = (xmlHashTablePtr)0x0;
  schema->doc = (xmlDocPtr)0x0;
  *(undefined8 *)&schema->idref = 0;
  schema->_private = (void *)0x0;
  schema->topgrammar = (xmlRelaxNGGrammarPtr_conflict)0x0;
  pxVar1 = ctxt->define;
  ctxt->define = (xmlChar *)0x0;
  if ((((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
      (iVar4 = xmlStrEqual(node->name,"grammar"), iVar4 == 0)) ||
     (iVar4 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
     iVar4 == 0)) {
    pxVar5 = (xmlRelaxNGGrammarPtr_conflict)(*xmlMalloc)(0x40);
    if (pxVar5 != (xmlRelaxNGGrammarPtr_conflict)0x0) {
      pxVar5->defs = (xmlHashTablePtr)0x0;
      pxVar5->refs = (xmlHashTablePtr)0x0;
      *(undefined8 *)&pxVar5->combine = 0;
      pxVar5->startList = (xmlRelaxNGDefinePtr_conflict)0x0;
      pxVar5->next = (xmlRelaxNGGrammarPtr)0x0;
      pxVar5->start = (xmlRelaxNGDefinePtr_conflict)0x0;
      pxVar5->parent = (xmlRelaxNGGrammarPtr)0x0;
      pxVar5->children = (xmlRelaxNGGrammarPtr)0x0;
      schema->topgrammar = pxVar5;
      pxVar2 = ctxt->grammar;
      pxVar5->parent = pxVar2;
      if (pxVar2 == (xmlRelaxNGGrammarPtr)0x0) {
        ctxt->grammar = pxVar5;
        xmlRelaxNGParseStart(ctxt,node);
      }
      else {
        pxVar3 = pxVar2->children;
        if (pxVar2->children == (xmlRelaxNGGrammarPtr)0x0) {
          pxVar2->children = pxVar5;
        }
        else {
          do {
            pxVar7 = pxVar3;
            pxVar3 = pxVar7->next;
          } while (pxVar3 != (xmlRelaxNGGrammarPtr)0x0);
          pxVar7->next = pxVar5;
        }
        ctxt->grammar = pxVar5;
        xmlRelaxNGParseStart(ctxt,node);
        ctxt->grammar = pxVar2;
      }
      goto LAB_0017420b;
    }
    xmlRngPErrMemory(ctxt,(char *)0x0);
    schema->topgrammar = (xmlRelaxNGGrammarPtr_conflict)0x0;
  }
  else {
    pxVar5 = xmlRelaxNGParseGrammar(ctxt,node->children);
    schema->topgrammar = pxVar5;
    if (pxVar5 != (xmlRelaxNGGrammarPtr_conflict)0x0) {
LAB_0017420b:
      ctxt->define = pxVar1;
      pxVar6 = schema->topgrammar->start;
      if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return schema;
      }
      xmlRelaxNGCheckCycles(ctxt,pxVar6,0);
      if ((ctxt->flags & 0x80) != 0) {
        return schema;
      }
      xmlRelaxNGSimplify(ctxt,schema->topgrammar->start,(xmlRelaxNGDefinePtr_conflict)0x0);
      pxVar5 = schema->topgrammar;
      pxVar6 = pxVar5->start;
      cur = (xmlRelaxNGDefinePtr_conflict)0x0;
      if (pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0) {
        do {
          cur = pxVar6;
          if ((pxVar6->type != XML_RELAXNG_NOOP) || (pxVar6->next == (xmlRelaxNGDefinePtr)0x0))
          break;
          pxVar6 = pxVar6->content;
          pxVar5->start = pxVar6;
          cur = (xmlRelaxNGDefinePtr_conflict)0x0;
        } while (pxVar6 != (xmlRelaxNGDefinePtr)0x0);
      }
      xmlRelaxNGCheckRules(ctxt,cur,0x10,XML_RELAXNG_NOOP);
      return schema;
    }
  }
  xmlRelaxNGFree(schema);
  return (xmlRelaxNGPtr)0x0;
}

Assistant:

static xmlRelaxNGPtr
xmlRelaxNGParseDocument(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGPtr schema = NULL;
    const xmlChar *olddefine;
    xmlRelaxNGGrammarPtr old;

    if ((ctxt == NULL) || (node == NULL))
        return (NULL);

    schema = xmlRelaxNGNewRelaxNG(ctxt);
    if (schema == NULL)
        return (NULL);

    olddefine = ctxt->define;
    ctxt->define = NULL;
    if (IS_RELAXNG(node, "grammar")) {
        schema->topgrammar = xmlRelaxNGParseGrammar(ctxt, node->children);
        if (schema->topgrammar == NULL) {
            xmlRelaxNGFree(schema);
            return (NULL);
        }
    } else {
        xmlRelaxNGGrammarPtr tmp, ret;

        schema->topgrammar = ret = xmlRelaxNGNewGrammar(ctxt);
        if (schema->topgrammar == NULL) {
            xmlRelaxNGFree(schema);
            return (NULL);
        }
        /*
         * Link the new grammar in the tree
         */
        ret->parent = ctxt->grammar;
        if (ctxt->grammar != NULL) {
            tmp = ctxt->grammar->children;
            if (tmp == NULL) {
                ctxt->grammar->children = ret;
            } else {
                while (tmp->next != NULL)
                    tmp = tmp->next;
                tmp->next = ret;
            }
        }
        old = ctxt->grammar;
        ctxt->grammar = ret;
        xmlRelaxNGParseStart(ctxt, node);
        if (old != NULL)
            ctxt->grammar = old;
    }
    ctxt->define = olddefine;
    if (schema->topgrammar->start != NULL) {
        xmlRelaxNGCheckCycles(ctxt, schema->topgrammar->start, 0);
        if ((ctxt->flags & XML_RELAXNG_IN_EXTERNALREF) == 0) {
            xmlRelaxNGSimplify(ctxt, schema->topgrammar->start, NULL);
            while ((schema->topgrammar->start != NULL) &&
                   (schema->topgrammar->start->type == XML_RELAXNG_NOOP) &&
                   (schema->topgrammar->start->next != NULL))
                schema->topgrammar->start =
                    schema->topgrammar->start->content;
            xmlRelaxNGCheckRules(ctxt, schema->topgrammar->start,
                                 XML_RELAXNG_IN_START, XML_RELAXNG_NOOP);
        }
    }
#ifdef DEBUG
    if (schema == NULL)
        xmlGenericError(xmlGenericErrorContext,
                        "xmlRelaxNGParseDocument() failed\n");
#endif

    return (schema);
}